

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O3

void __thiscall HSimplexNla::unapplyBasisMatrixRowScale(HSimplexNla *this,HVector *rhs)

{
  uint uVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  if (this->scale_ != (HighsScale *)0x0) {
    uVar1 = rhs->count;
    uVar6 = this->lp_->num_row_;
    bVar5 = (double)(int)uVar6 * 0.4 <= (double)(int)uVar1;
    if (!bVar5 && (int)uVar1 >= 0) {
      uVar6 = uVar1;
    }
    if (0 < (int)uVar6) {
      piVar2 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->scale_->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
      do {
        if (bVar5 || (int)uVar1 < 0) {
          iVar7 = (int)uVar8;
        }
        else {
          iVar7 = piVar2[uVar8];
        }
        pdVar3[iVar7] = pdVar3[iVar7] / pdVar4[iVar7];
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
  }
  return;
}

Assistant:

void HSimplexNla::unapplyBasisMatrixRowScale(HVector& rhs) const {
  if (scale_ == NULL) return;
  const vector<double>& row_scale = scale_->row;
  HighsInt to_entry;
  const bool use_row_indices =
      sparseLoopStyle(rhs.count, lp_->num_row_, to_entry);
  for (HighsInt iEntry = 0; iEntry < to_entry; iEntry++) {
    const HighsInt iRow = use_row_indices ? rhs.index[iEntry] : iEntry;
    rhs.array[iRow] /= row_scale[iRow];
  }
}